

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void thread_main(void *arg)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uv_handle_t *handle;
  char buf [4096];
  undefined1 auStack_1018 [4096];
  
  uv_barrier_wait((uv_barrier_t *)arg);
  do {
    do {
      handle = (uv_handle_t *)(ulong)*(uint *)((long)arg + 0x20);
      sVar2 = read(*(uint *)((long)arg + 0x20),auStack_1018,0x1000);
    } while (0 < sVar2);
    if (sVar2 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (sVar2 == 0) {
    return;
  }
  thread_main_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT(result == nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}